

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionTracking::TestCaseTracker::Guard::~Guard(Guard *this)

{
  Guard *this_local;
  
  leaveTestCase(this->m_tracker);
  return;
}

Assistant:

~Guard() {
                m_tracker.leaveTestCase();
            }